

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O0

vector<Sphere,_std::allocator<Sphere>_> *
treecut(vector<Sphere,_std::allocator<Sphere>_> *__return_storage_ptr__,SphereTree *hierarchy,
       vec3f cluster_center,float cluster_radius,float angle_limit)

{
  float fVar1;
  double dVar2;
  initializer_list<Sphere> __l;
  bool bVar3;
  bool bVar4;
  vector<SphereTree,_std::allocator<SphereTree>_> *this;
  reference pSVar5;
  iterator __first;
  iterator __last;
  data_t dVar6;
  vec3f vVar7;
  __normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_> local_128;
  const_iterator local_120;
  vec3f local_118;
  vec3f local_108;
  undefined1 local_f8 [8];
  vector<Sphere,_std::allocator<Sphere>_> cut;
  SphereTree c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range1;
  allocator<Sphere> local_89;
  Sphere local_88;
  iterator local_70;
  size_type local_68;
  vec3f local_60;
  vec3f local_4c;
  float local_40;
  float local_3c;
  float angle_limit_local;
  float cluster_radius_local;
  SphereTree *hierarchy_local;
  data_t local_24;
  undefined1 local_1c [8];
  vec3f cluster_center_local;
  vector<Sphere,_std::allocator<Sphere>_> *res;
  
  local_24 = cluster_center.z;
  unique0x100000cf = cluster_center._0_8_;
  local_40 = angle_limit;
  local_3c = cluster_radius;
  _angle_limit_local = hierarchy;
  local_1c = (undefined1  [8])unique0x100000cf;
  cluster_center_local.x = local_24;
  cluster_center_local._4_8_ = __return_storage_ptr__;
  bVar3 = std::vector<SphereTree,_std::allocator<SphereTree>_>::empty(&hierarchy->child);
  bVar4 = true;
  if (!bVar3) {
    fVar1 = (_angle_limit_local->bound).radius;
    dVar2 = std::sin((double)(ulong)(uint)local_40);
    vVar7 = operator-((vec3f *)_angle_limit_local,(vec3f *)local_1c);
    local_60.z = vVar7.z;
    local_60._0_8_ = vVar7._0_8_;
    local_4c._0_8_ = local_60._0_8_;
    local_4c.z = local_60.z;
    dVar6 = norm(&local_4c);
    bVar4 = fVar1 < SUB84(dVar2,0) * (dVar6 - local_3c);
  }
  if (bVar4) {
    local_88.center.x = (_angle_limit_local->bound).center.x;
    local_88.center.y = (_angle_limit_local->bound).center.y;
    local_88._8_8_ = *(undefined8 *)&(_angle_limit_local->bound).center.z;
    local_70 = &local_88;
    local_68 = 1;
    std::allocator<Sphere>::allocator(&local_89);
    __l._M_len = local_68;
    __l._M_array = local_70;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector(__return_storage_ptr__,__l,&local_89);
    std::allocator<Sphere>::~allocator(&local_89);
  }
  else {
    std::vector<Sphere,_std::allocator<Sphere>_>::vector(__return_storage_ptr__);
    this = &_angle_limit_local->child;
    __end1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin(this);
    c.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end(this);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                       *)&c.child.
                                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar4
          ) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
               ::operator*(&__end1);
      SphereTree::SphereTree
                ((SphereTree *)
                 &cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pSVar5);
      local_108.z = cluster_center_local.x;
      local_108.x = (data_t)local_1c._0_4_;
      local_108.y = (data_t)local_1c._4_4_;
      local_118.z = cluster_center_local.x;
      local_118.x = (data_t)local_1c._0_4_;
      local_118.y = (data_t)local_1c._4_4_;
      vVar7.z = cluster_center_local.x;
      vVar7.x = (data_t)local_1c._0_4_;
      vVar7.y = (data_t)local_1c._4_4_;
      treecut((vector<Sphere,_std::allocator<Sphere>_> *)local_f8,
              (SphereTree *)
              &cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,vVar7,local_3c,local_40);
      local_128._M_current =
           (Sphere *)std::vector<Sphere,_std::allocator<Sphere>_>::end(__return_storage_ptr__);
      __gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>::
      __normal_iterator<Sphere*>
                ((__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>> *)
                 &local_120,&local_128);
      __first = std::vector<Sphere,_std::allocator<Sphere>_>::begin
                          ((vector<Sphere,_std::allocator<Sphere>_> *)local_f8);
      __last = std::vector<Sphere,_std::allocator<Sphere>_>::end
                         ((vector<Sphere,_std::allocator<Sphere>_> *)local_f8);
      std::vector<Sphere,std::allocator<Sphere>>::
      insert<__gnu_cxx::__normal_iterator<Sphere*,std::vector<Sphere,std::allocator<Sphere>>>,void>
                ((vector<Sphere,std::allocator<Sphere>> *)__return_storage_ptr__,local_120,
                 (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                 __first._M_current,
                 (__normal_iterator<Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>)
                 __last._M_current);
      std::vector<Sphere,_std::allocator<Sphere>_>::~vector
                ((vector<Sphere,_std::allocator<Sphere>_> *)local_f8);
      SphereTree::~SphereTree
                ((SphereTree *)
                 &cut.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
      operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sphere> treecut(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
		return {hierarchy.bound};
	std::vector<Sphere> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut(c, cluster_center, cluster_radius, angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}